

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_loadScript(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *filename;
  uint8_t *input;
  ulong uVar1;
  int64_t iVar2;
  ulong uVar3;
  JSValue JVar4;
  size_t buf_len;
  size_t local_30;
  
  filename = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  iVar2 = 6;
  if (filename != (char *)0x0) {
    input = js_load_file(ctx,&local_30,filename);
    if (input != (uint8_t *)0x0) {
      JVar4 = JS_Eval(ctx,(char *)input,local_30,filename,0);
      iVar2 = JVar4.tag;
      js_free(ctx,input);
      JS_FreeCString(ctx,filename);
      uVar1 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
      uVar3 = (ulong)JVar4.u.ptr & 0xffffffff;
      goto LAB_0010f1cd;
    }
    JS_ThrowReferenceError(ctx,"could not load \'%s\'",filename);
    JS_FreeCString(ctx,filename);
  }
  uVar3 = 0;
  uVar1 = 0;
LAB_0010f1cd:
  JVar4.tag = iVar2;
  JVar4.u.ptr = (void *)(uVar3 | uVar1);
  return JVar4;
}

Assistant:

static JSValue js_loadScript(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    uint8_t *buf;
    const char *filename;
    JSValue ret;
    size_t buf_len;
    
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        return JS_EXCEPTION;
    buf = js_load_file(ctx, &buf_len, filename);
    if (!buf) {
        JS_ThrowReferenceError(ctx, "could not load '%s'", filename);
        JS_FreeCString(ctx, filename);
        return JS_EXCEPTION;
    }
    ret = JS_Eval(ctx, (char *)buf, buf_len, filename,
                  JS_EVAL_TYPE_GLOBAL);
    js_free(ctx, buf);
    JS_FreeCString(ctx, filename);
    return ret;
}